

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O1

int encodeLatLonToMapcodes_internal
              (Mapcodes *mapcodes,double lat,double lon,Territory territoryContext,
              int stop_with_one_result,int requiredEncoder,int extraDigits)

{
  int iVar1;
  uint uVar2;
  MapcodeError MVar3;
  int iVar4;
  int iVar5;
  Territory ccode;
  Territory in_R9D;
  uint uVar6;
  EncodeRec enc;
  EncodeRec local_48;
  
  mapcodes->count = 0;
  local_48.mapcodes = mapcodes;
  MVar3 = convertCoordsToMicrosAndFractions
                    (&local_48.coord32,&local_48.fraclat,&local_48.fraclon,lat,lon);
  if (MVar3 < ERR_OK) {
    iVar5 = 0;
  }
  else {
    if (territoryContext < _TERRITORY_MIN) {
      iVar4 = 0;
      iVar5 = local_48.coord32.lonMicroDeg;
      do {
        iVar1 = iVar4 + 1;
        uVar2 = REDIVAR[iVar4];
        if (uVar2 < 0x400) {
          uVar6 = 0;
          while( true ) {
            ccode = TERRITORY_AAA;
            if (uVar2 != uVar6) {
              ccode = REDIVAR[(int)(iVar1 + uVar6)];
            }
            encoderEngine(ccode,&local_48,stop_with_one_result,requiredEncoder,-1,in_R9D);
            iVar4 = iVar1;
            if (((stop_with_one_result != 0) && (0 < (local_48.mapcodes)->count)) ||
               ((int)uVar2 <= (int)uVar6)) break;
            uVar6 = uVar6 + 1;
          }
        }
        else {
          iVar5 = (local_48.coord32.latMicroDeg + local_48.coord32.lonMicroDeg) - iVar5;
          if ((int)uVar2 < iVar5) {
            iVar4 = REDIVAR[iVar1];
          }
          else {
            iVar4 = iVar4 + 2;
          }
        }
      } while (0x3ff < uVar2);
    }
    else {
      encoderEngine(territoryContext,&local_48,stop_with_one_result,requiredEncoder,-1,in_R9D);
    }
    iVar5 = mapcodes->count;
  }
  return iVar5;
}

Assistant:

static int encodeLatLonToMapcodes_internal(Mapcodes *mapcodes,
                                           const double lat, const double lon,
                                           const enum Territory territoryContext, const int stop_with_one_result,
                                           const int requiredEncoder, const int extraDigits) {
    EncodeRec enc;
    enc.mapcodes = mapcodes;
    enc.mapcodes->count = 0;
    ASSERT(mapcodes);
    ASSERT((0 <= extraDigits) && (extraDigits <= MAX_PRECISION_DIGITS));

    if (convertCoordsToMicrosAndFractions(&enc.coord32, &enc.fraclat, &enc.fraclon, lat, lon) < 0) {
        return 0;
    }

    if (territoryContext < _TERRITORY_MIN) // ALL results?
    {

#ifndef NO_FAST_ENCODE
        {
            const int sum = enc.coord32.lonMicroDeg + enc.coord32.latMicroDeg;
            int coord = enc.coord32.lonMicroDeg;
            int i = 0; // pointer into REDIVAR
            for (;;) {
                const int r = REDIVAR[i++];
                if (r >= 0 && r < 1024) { // leaf?
                    int j;
                    for (j = 0; j <= r; j++) {
                        const enum Territory ccode = (j == r ? TERRITORY_AAA : (enum Territory) REDIVAR[i + j]);
                        encoderEngine(ccode, &enc, stop_with_one_result, extraDigits, requiredEncoder, TERRITORY_NONE);
                        if ((stop_with_one_result || (requiredEncoder >= 0)) && (enc.mapcodes->count > 0)) {
                            break;
                        }
                    }
                    break;
                } else {
                    coord = sum - coord;
                    if (coord > r) {
                        i = REDIVAR[i];
                    } else {
                        i++;
                    }
                }
            }
        }
#else
        {
            int i;
            for (i = _TERRITORY_MIN + 1; i < _TERRITORY_MAX; i++) {
                encoderEngine((enum Territory) i, &enc, stop_with_one_result, extraDigits, requiredEncoder, TERRITORY_NONE);
                if ((stop_with_one_result || (requiredEncoder >= 0)) && (enc.mapcodes->count > 0)) {
                    break;
                }
            }
        }
#endif

    } else {
        encoderEngine(territoryContext, &enc, stop_with_one_result, extraDigits, requiredEncoder, TERRITORY_NONE);
    }
    return mapcodes->count;
}